

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

domain_manager * __thiscall
cs::domain_manager::add_var<std::__cxx11::string_const&>
          (domain_manager *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,var *val,
          bool is_override)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *this_00;
  byte in_CL;
  string *in_RSI;
  domain_manager *in_RDI;
  string *in_stack_fffffffffffffee8;
  runtime_error *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  string *in_stack_ffffffffffffff10;
  domain_type *in_stack_ffffffffffffff18;
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff30;
  string local_80 [103];
  byte local_19;
  string *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  if (*in_RDI->fiber_stack == (stack_pointer)0x0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff30);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       (var *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff10,local_10);
      std::operator+((char *)in_stack_fffffffffffffef8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::operator+(in_stack_fffffffffffffef8,(char *)this_00);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffee8);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff30);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       (var *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      std::__cxx11::string::string(local_80,local_10);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffef0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffef0);
      runtime_error::runtime_error(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      __cxa_throw(__lhs,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return in_RDI;
}

Assistant:

domain_manager &add_var(T &&name, const var &val, bool is_override)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			return *this;
		}